

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAML.h
# Opt level: O3

int jaegertracing::utils::yaml::findOrDefault<int,char[14],int>
              (Node *node,char (*key) [14],int *defaultValue)

{
  int iVar1;
  Node valueNode;
  Node local_38;
  as_if<int,_void> local_18;
  
  YAML::Node::operator[]<char[14]>(&local_38,node,key);
  if ((local_38.m_isValid == true) &&
     ((local_38.m_pNode == (node *)0x0 || (*(char *)**(undefined8 **)local_38.m_pNode != '\0')))) {
    local_18.node = &local_38;
    iVar1 = YAML::as_if<int,_void>::operator()(&local_18);
  }
  else {
    iVar1 = *defaultValue;
  }
  if (local_38.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.m_pMemory.
               super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return iVar1;
}

Assistant:

ValueType findOrDefault(const YAML::Node& node,
                        const KeyType& key,
                        const DefaultValueType& defaultValue)
{
    const auto valueNode = node[key];
    if (!valueNode.IsDefined()) {
        return defaultValue;
    }
    return valueNode.template as<ValueType>();
}